

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.cpp
# Opt level: O0

size_t qHash(QLatin1StringView key,size_t seed)

{
  size_t sVar1;
  size_t in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  size_t seed2;
  size_t size;
  uchar *data;
  size_t in_stack_ffffffffffffffe0;
  uchar *data_00;
  
  data_00 = *(uchar **)(in_FS_OFFSET + 0x28);
  QLatin1StringView::data((QLatin1StringView *)&stack0xffffffffffffffe8);
  QLatin1StringView::size((QLatin1StringView *)&stack0xffffffffffffffe8);
  sVar1 = qHashBits_fallback<(ZeroExtension)1>
                    (data_00,in_RSI,(size_t)in_RDI,in_stack_ffffffffffffffe0);
  if (*(uchar **)(in_FS_OFFSET + 0x28) != data_00) {
    __stack_chk_fail();
  }
  return sVar1;
}

Assistant:

size_t qHash(QLatin1StringView key, size_t seed) noexcept
{
#ifdef QT_BOOTSTRAPPED
    // the seed is always 0 in bootstrapped mode (no seed generation code),
    // so help the compiler do dead code elimination
    seed = 0;
#endif

    auto data = reinterpret_cast<const uchar *>(key.data());
    size_t size = key.size();

    // Mix in the length as a secondary seed.
    // Multiplied by 2 to match the byte size of the equiavlent UTF-16 string.
    size_t seed2 = size * 2;
    if (seed)
        seed2 = qt_qhash_seed.currentSeed(1);

#if defined(AESHASH)
    if (seed && qCpuHasFeature(AES) && qCpuHasFeature(SSE4_2))
        return aeshash<ByteToWord>(data, size, seed, seed2);
#endif
    return qHashBits_fallback<ByteToWord>(data, size, seed, seed2);
}